

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

double __thiscall chrono::ChSystem::GetSolverTolerance(ChSystem *this)

{
  pointer pcVar1;
  shared_ptr<chrono::ChIterativeSolver> iter_solver;
  shared_ptr<chrono::ChSolver> local_18;
  
  std::dynamic_pointer_cast<chrono::ChIterativeSolver,chrono::ChSolver>(&local_18);
  if (local_18.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pcVar1 = (pointer)0x0;
  }
  else {
    pcVar1 = ((local_18.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             output_dir)._M_dataplus._M_p;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return (double)pcVar1;
}

Assistant:

double ChSystem::GetSolverTolerance() const {
    if (auto iter_solver = std::dynamic_pointer_cast<ChIterativeSolver>(solver)) {
        return iter_solver->GetTolerance();
    }
    return 0;
}